

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::RecurseError(Parser *this)

{
  long *plVar1;
  long *plVar2;
  string *in_RSI;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  NumToString<int>(&local_40,*(int *)((long)&in_RSI[0x3b].field_2 + 0xc));
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1b0552);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Error(this,in_RSI);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::RecurseError() {
  return Error("maximum parsing depth " + NumToString(parse_depth_counter_) +
               " reached");
}